

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter_tests.c
# Opt level: O0

xmlNodePtr xmlnode_find_sibling(xmlNodePtr node,char *name)

{
  int iVar1;
  undefined8 in_RSI;
  xmlNodePtr in_RDI;
  xmlNodePtr local_8;
  
  local_8 = in_RDI;
  while ((local_8 != (xmlNodePtr)0x0 && (iVar1 = xmlStrEqual(local_8->name,in_RSI), iVar1 == 0))) {
    local_8 = (xmlNodePtr)xmlNextElementSibling(local_8);
  }
  return local_8;
}

Assistant:

static xmlNodePtr xmlnode_find_sibling(xmlNodePtr node, const char *name)
{
    while (node) {
        if (xmlStrEqual(node->name, XMLSTRING(name)))
            break;
        node = xmlNextElementSibling(node);
    }
    return node;
}